

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

double __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::ExpFunc::precision
          (ExpFunc *this,EvalContext *ctx,double ret,double x)

{
  Precision PVar1;
  double dVar2;
  double x_local;
  double ret_local;
  EvalContext *ctx_local;
  ExpFunc *this_local;
  
  PVar1 = ctx->floatPrecision;
  if (PVar1 == PRECISION_LOWP) {
    this_local = (ExpFunc *)tcu::FloatFormat::ulp(&ctx->format,ret,2.0);
  }
  else if (PVar1 == PRECISION_MEDIUMP) {
    dVar2 = deAbs(x);
    this_local = (ExpFunc *)tcu::FloatFormat::ulp(&ctx->format,ret,dVar2 + dVar2 + 2.0);
  }
  else if (PVar1 == PRECISION_HIGHP) {
    dVar2 = deAbs(x);
    this_local = (ExpFunc *)tcu::FloatFormat::ulp(&ctx->format,ret,dVar2 + dVar2 + 3.0);
  }
  else {
    this_local = (ExpFunc *)0x0;
  }
  return (double)this_local;
}

Assistant:

double		precision	(const EvalContext& ctx, double ret, double x) const
	{
		switch (ctx.floatPrecision)
		{
			case glu::PRECISION_HIGHP:
				return ctx.format.ulp(ret, 3.0 + 2.0 * deAbs(x));
			case glu::PRECISION_MEDIUMP:
				return ctx.format.ulp(ret, 2.0 + 2.0 * deAbs(x));
			case glu::PRECISION_LOWP:
				return ctx.format.ulp(ret, 2.0);
			default:
				DE_FATAL("Impossible");
		}
		return 0;
	}